

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

void unodb::qsbr_per_thread::set_instance
               (unique_ptr<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>
                *new_instance)

{
  long *in_FS_OFFSET;
  
  current_thread_instance::__tls_init();
  std::__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_>::
  operator=((__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *
            )(*in_FS_OFFSET + -0x20),
            (__uniq_ptr_impl<unodb::qsbr_per_thread,_std::default_delete<unodb::qsbr_per_thread>_> *
            )new_instance);
  detail::
  on_thread_exit<unodb::qsbr_per_thread::set_instance(std::unique_ptr<unodb::qsbr_per_thread,std::default_delete<unodb::qsbr_per_thread>>)::_lambda()_1_>
            ();
  return;
}

Assistant:

static void set_instance(
      std::unique_ptr<qsbr_per_thread> new_instance) noexcept {
    current_thread_instance = std::move(new_instance);
#ifndef UNODB_DETAIL_MSVC_CLANG
    // Force qsbr_per_thread destructor to run on thread exit. It already runs
    // without this kludge on most configurations, except with gcc --coverage on
    // macOS, and it seems it is not guaranteed -
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=61991
    detail::on_thread_exit([]() noexcept { current_thread_instance.reset(); });
#endif
  }